

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void c4::yml::report_error_impl(char *msg,size_t length,Location loc,FILE *f)

{
  bool bVar1;
  FILE *in_RDX;
  ulong in_RSI;
  undefined8 in_RDI;
  size_t in_stack_00000008;
  size_t in_stack_00000010;
  FILE *local_20;
  
  local_20 = in_RDX;
  if (in_RDX == (FILE *)0x0) {
    local_20 = _stderr;
  }
  bVar1 = Location::operator_cast_to_bool((Location *)&stack0x00000008);
  if (bVar1) {
    if (msg != (char *)0x0 && length != 0) {
      fwrite((void *)length,1,(size_t)msg,local_20);
      fputc(0x3a,local_20);
    }
    fprintf(local_20,"%zu:",in_stack_00000010);
    if (f != (FILE *)0x0) {
      fprintf(local_20,"%zu:",f);
    }
    if (in_stack_00000008 != 0) {
      fprintf(local_20," (%zuB):",in_stack_00000008);
    }
  }
  fprintf(local_20,"%.*s\n",in_RSI & 0xffffffff,in_RDI);
  fflush(local_20);
  return;
}

Assistant:

void report_error_impl(const char* msg, size_t length, Location loc, FILE *f)
{
    if(!f)
        f = stderr;
    if(loc)
    {
        if(!loc.name.empty())
        {
            fwrite(loc.name.str, 1, loc.name.len, f);
            fputc(':', f);
        }
        fprintf(f, "%zu:", loc.line);
        if(loc.col)
            fprintf(f, "%zu:", loc.col);
        if(loc.offset)
            fprintf(f, " (%zuB):", loc.offset);
    }
    fprintf(f, "%.*s\n", (int)length, msg);
    fflush(f);
}